

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

int __thiscall amrex::Amr::init(Amr *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  Real in_XMM0_Qa;
  Real in_XMM1_Qa;
  
  if ((this->restart_chkfile)._M_string_length != 0) {
    bVar1 = std::operator!=(&this->restart_chkfile,"init");
    if (bVar1) {
      restart(this,&this->restart_chkfile);
      return extraout_EAX;
    }
  }
  initialInit(this,in_XMM0_Qa,in_XMM1_Qa,(BoxArray *)0x0,(Vector<int,_std::allocator<int>_> *)0x0);
  if ((0 < this->check_int) || (iVar2 = extraout_EAX_00, 0.0 < this->check_per)) {
    iVar2 = (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xf])(this);
  }
  if (((0 < this->plot_int) || (0.0 < this->plot_per)) || (0.0 < this->plot_log_per)) {
    iVar2 = (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xd])(this);
  }
  if (((this->small_plot_int < 1) && (this->small_plot_per <= 0.0)) &&
     (this->small_plot_log_per <= 0.0)) {
    return iVar2;
  }
  iVar2 = (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xe])(this);
  return iVar2;
}

Assistant:

void
Amr::init (Real strt_time,
           Real stop_time)
{
    BL_PROFILE_REGION_START("Amr::init()");
    BL_PROFILE("Amr::init()");
    if( ! restart_chkfile.empty() && restart_chkfile != "init")
    {
        restart(restart_chkfile);
    }
    else
    {
        initialInit(strt_time,stop_time);
        if (check_int > 0 || check_per > 0) {
            checkPoint();
        }

        if(plot_int > 0 || plot_per > 0 || plot_log_per > 0) {
            writePlotFile();
        }

        if (small_plot_int > 0 || small_plot_per > 0 || small_plot_log_per > 0) {
            writeSmallPlotFile();
        }

        updateInSitu();
    }

#ifdef BL_COMM_PROFILING
    Vector<Box> probDomain(maxLevel()+1);
    for(int i(0); i < probDomain.size(); ++i) {
        probDomain[i] = Geom(i).Domain();
    }
    BL_COMM_PROFILE_INITAMR(finest_level, max_level, ref_ratio, probDomain);
#endif
    BL_PROFILE_REGION_STOP("Amr::init()");
}